

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall
cfgfile::details::parser_base_t<cfgfile::string_trait_t>::check_parser_state_after_parsing
          (parser_base_t<cfgfile::string_trait_t> *this)

{
  bool bVar1;
  undefined8 uVar2;
  reference pptVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  allocator *paVar4;
  string_t *in_stack_fffffffffffffe18;
  exception_t<cfgfile::string_trait_t> *in_stack_fffffffffffffe20;
  exception_t<cfgfile::string_trait_t> *this_00;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffffe28;
  undefined6 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4e;
  undefined1 uVar5;
  allocator in_stack_fffffffffffffe4f;
  string local_1b0 [71];
  undefined1 local_169 [135];
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [87];
  allocator local_89;
  string local_88 [136];
  
  bVar1 = std::
          stack<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
          ::empty((stack<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                   *)0x13aa85);
  if (!bVar1) {
    local_e2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_88,"Unexpected end of file. Still unfinished tag \"",&local_89);
    string_trait_t::from_ascii(in_stack_fffffffffffffe08);
    pptVar3 = std::
              stack<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
              ::top((stack<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                     *)0x13aaf6);
    tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(*pptVar3);
    std::operator+(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    paVar4 = &local_e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"\".",paVar4);
    string_trait_t::from_ascii(in_stack_fffffffffffffe08);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe4f,
                            CONCAT16(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48)),in_RDI);
    exception_t<cfgfile::string_trait_t>::exception_t
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    local_e2 = 0;
    __cxa_throw(uVar2,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  bVar1 = tag_t<cfgfile::string_trait_t>::is_mandatory
                    (*(tag_t<cfgfile::string_trait_t> **)(in_RDI + 8));
  if ((bVar1) &&
     (bVar1 = tag_t<cfgfile::string_trait_t>::is_defined(in_stack_fffffffffffffe28), !bVar1)) {
    uVar5 = 1;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x30);
    this_00 = (exception_t<cfgfile::string_trait_t> *)local_169;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_169 + 1),"Undefined mandatory tag: \"",(allocator *)this_00);
    string_trait_t::from_ascii(in_stack_fffffffffffffe08);
    tag_t<cfgfile::string_trait_t>::name_abi_cxx11_
              (*(tag_t<cfgfile::string_trait_t> **)(in_RDI + 8));
    std::operator+(__lhs,in_stack_fffffffffffffe10);
    paVar4 = (allocator *)&stack0xfffffffffffffe4f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b0,"\".",paVar4);
    string_trait_t::from_ascii(in_stack_fffffffffffffe08);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe4f,CONCAT16(uVar5,in_stack_fffffffffffffe48)),
                   in_RDI);
    exception_t<cfgfile::string_trait_t>::exception_t(this_00,__lhs);
    __cxa_throw(__lhs,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  return;
}

Assistant:

void check_parser_state_after_parsing()
	{
		if( !m_stack.empty() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected end of file. "
					"Still unfinished tag \"" ) + m_stack.top()->name() +
				Trait::from_ascii( "\"." ) );

		if( m_tag.is_mandatory() && !m_tag.is_defined() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Undefined mandatory tag: \"" ) +
				m_tag.name() + Trait::from_ascii( "\"." ) );
	}